

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::highlightNextSubWindow(QMdiAreaPrivate *this,int increaseFactor)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QMdiArea *pQVar4;
  QMdiSubWindow *pQVar5;
  int in_ESI;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar6;
  QMdiArea *q;
  QMdiSubWindow *highlight;
  QMdiSubWindow *current;
  undefined4 in_stack_ffffffffffffff78;
  WindowType in_stack_ffffffffffffff7c;
  QWidget *in_stack_ffffffffffffff80;
  QAnyStringView *this_00;
  QFlagsStorage<Qt::WindowType> flags;
  QMdiAreaPrivate *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QMdiSubWindow *subWindow;
  undefined1 in_stack_ffffffffffffffa8 [16];
  WindowOrder in_stack_ffffffffffffffc0;
  QMdiAreaPrivate *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  qVar3 = QList<QPointer<QMdiSubWindow>_>::size(&in_RDI->childWindows);
  if (qVar3 != 1) {
    pQVar4 = q_func(in_RDI);
    if (in_RDI->indexToHighlighted < 0) {
      pQVar5 = QMdiArea::currentSubWindow((QMdiArea *)in_RDI);
      if (pQVar5 == (QMdiSubWindow *)0x0) goto LAB_006125ce;
      qVar3 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                        ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                         in_stack_ffffffffffffff80,
                         (QMdiSubWindow **)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0x61246c);
      in_RDI->indexToHighlighted = (int)qVar3;
    }
    pQVar5 = nextVisibleSubWindow
                       (this_01,in_ESI,in_stack_ffffffffffffffc0,(int)((ulong)pQVar4 >> 0x20),
                        (int)pQVar4);
    subWindow = in_stack_ffffffffffffffa8._0_8_;
    if (pQVar5 != (QMdiSubWindow *)0x0) {
      if (in_RDI->rubberBand == (QRubberBand *)0x0) {
        in_stack_ffffffffffffff80 = (QWidget *)operator_new(0x28);
        QRubberBand::QRubberBand
                  (in_stack_ffffffffffffffa8._8_8_,in_stack_ffffffffffffffa8._4_4_,
                   (QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        in_RDI->rubberBand = (QRubberBand *)in_stack_ffffffffffffff80;
        this_00 = (QAnyStringView *)in_RDI->rubberBand;
        QVar6 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)this_00,(size_t)in_stack_ffffffffffffff80);
        subWindow = (QMdiSubWindow *)QVar6.m_size;
        QVar6.m_data = (char *)in_RDI;
        QVar6.m_size = (qsizetype)in_stack_ffffffffffffff90;
        QAnyStringView::QAnyStringView(this_00,QVar6);
        QObject::setObjectName((QAnyStringView *)this_00);
        flags.i = (Int)((ulong)this_00 >> 0x20);
        in_stack_ffffffffffffff90 = (QMdiAreaPrivate *)in_RDI->rubberBand;
        QWidget::windowFlags(in_stack_ffffffffffffff80);
        QFlags<Qt::WindowType>::operator|
                  ((QFlags<Qt::WindowType> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        QWidget::setWindowFlags(in_stack_ffffffffffffff80,(WindowFlags)flags.i);
      }
      bVar2 = QBasicTimer::isActive(&in_RDI->tabToPreviousTimer);
      if (!bVar2) {
        showRubberBandFor(in_stack_ffffffffffffff90,subWindow);
      }
      qVar3 = QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                        ((QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *)
                         in_stack_ffffffffffffff80,
                         (QMdiSubWindow **)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0x6125c0);
      in_RDI->indexToHighlighted = (int)qVar3;
    }
  }
LAB_006125ce:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::highlightNextSubWindow(int increaseFactor)
{
    if (childWindows.size() == 1)
        return;

    Q_Q(QMdiArea);
    // There's no highlighted sub-window atm, use current.
    if (indexToHighlighted < 0) {
        QMdiSubWindow *current = q->currentSubWindow();
        if (!current)
            return;
        indexToHighlighted = childWindows.indexOf(current);
    }

    Q_ASSERT(indexToHighlighted >= 0);
    Q_ASSERT(indexToHighlighted < childWindows.size());

    QMdiSubWindow *highlight = nextVisibleSubWindow(increaseFactor, activationOrder, -1, indexToHighlighted);
    if (!highlight)
        return;

#if QT_CONFIG(rubberband)
    if (!rubberBand) {
        rubberBand = new QRubberBand(QRubberBand::Rectangle, q);
        // For accessibility to identify this special widget.
        rubberBand->setObjectName("qt_rubberband"_L1);
        rubberBand->setWindowFlags(rubberBand->windowFlags() | Qt::WindowStaysOnTopHint);
    }
#endif

    // Only highlight if we're not switching back to the previously active window (Ctrl-Tab once).
#if QT_CONFIG(rubberband)
    if (!tabToPreviousTimer.isActive())
        showRubberBandFor(highlight);
#endif

    indexToHighlighted = childWindows.indexOf(highlight);
    Q_ASSERT(indexToHighlighted >= 0);
}